

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_with_face(REF_CELL ref_cell,REF_INT *face_nodes,REF_INT *cell0,REF_INT *cell1)

{
  uint uVar1;
  REF_INT local_1ac;
  REF_INT local_1a8;
  int local_1a4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT ncandidate;
  REF_INT target [27];
  REF_INT local_44;
  REF_INT ntarget;
  REF_INT cell;
  REF_INT cell_face;
  REF_INT same;
  REF_INT node;
  REF_INT item;
  REF_INT *cell1_local;
  REF_INT *cell0_local;
  REF_INT *face_nodes_local;
  REF_CELL ref_cell_local;
  
  *cell0 = -1;
  *cell1 = -1;
  ref_cell_local._4_4_ = ref_sort_unique_int(4,face_nodes,target + 0x1a,candidate + 0x1a);
  if (ref_cell_local._4_4_ == 0) {
    if ((*face_nodes < 0) || (ref_cell->ref_adj->nnode <= *face_nodes)) {
      local_1a4 = -1;
    }
    else {
      local_1a4 = ref_cell->ref_adj->first[*face_nodes];
    }
    same = local_1a4;
    if (local_1a4 == -1) {
      local_1a8 = -1;
    }
    else {
      local_1a8 = ref_cell->ref_adj->item[local_1a4].ref;
    }
    local_44 = local_1a8;
    while (same != -1) {
      for (ntarget = 0; ntarget < ref_cell->face_per; ntarget = ntarget + 1) {
        for (cell_face = 0; cell_face < 4; cell_face = cell_face + 1) {
          (&ref_private_macro_code_rss_1)[cell_face] =
               ref_cell->c2n[ref_cell->f2n[cell_face + ntarget * 4] + ref_cell->size_per * local_44]
          ;
        }
        uVar1 = ref_sort_unique_int(4,&ref_private_macro_code_rss_1,candidate + 0x19,orig + 0x1a);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x463,"ref_cell_with_face",(ulong)uVar1,"c uniq");
          return uVar1;
        }
        if (target[0x1a] == candidate[0x19]) {
          cell = 0;
          for (cell_face = 0; cell_face < target[0x1a]; cell_face = cell_face + 1) {
            if (candidate[(long)cell_face + 0x1a] == orig[(long)cell_face + 0x1a]) {
              cell = cell + 1;
            }
          }
          if (target[0x1a] == cell) {
            if (*cell0 == -1) {
              *cell0 = local_44;
            }
            else {
              if (*cell1 != -1) {
                return 3;
              }
              *cell1 = local_44;
            }
          }
        }
      }
      same = ref_cell->ref_adj->item[same].next;
      if (same == -1) {
        local_1ac = -1;
      }
      else {
        local_1ac = ref_cell->ref_adj->item[same].ref;
      }
      local_44 = local_1ac;
    }
    ref_cell_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x45c,
           "ref_cell_with_face",(ulong)ref_cell_local._4_4_,"t uniq");
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with_face(REF_CELL ref_cell, REF_INT *face_nodes,
                                      REF_INT *cell0, REF_INT *cell1) {
  REF_INT item, node, same, cell_face, cell;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell0) = REF_EMPTY;
  (*cell1) = REF_EMPTY;

  RSS(ref_sort_unique_int(4, face_nodes, &ntarget, target), "t uniq");

  each_ref_cell_having_node(ref_cell, face_nodes[0], item, cell) {
    each_ref_cell_cell_face(ref_cell, cell_face) {
      for (node = 0; node < 4; node++) {
        orig[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
      }
      RSS(ref_sort_unique_int(4, orig, &ncandidate, candidate), "c uniq");

      if (ntarget == ncandidate) {
        same = 0;
        for (node = 0; node < ntarget; node++) {
          if (target[node] == candidate[node]) same++;
        }

        if (ntarget == same) {
          if (REF_EMPTY == *cell0) {
            (*cell0) = cell;
          } else {
            if (REF_EMPTY != *cell1)
              return REF_INVALID; /* more than 2 cells with face */
            (*cell1) = cell;
          }
        }
      }
    }
  }

  return REF_SUCCESS;
}